

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint8_t *array;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t __size;
  size_t sVar6;
  char student_prompt [128];
  
  iVar1 = query_int("How many students to process? ",10,100);
  __size = (size_t)iVar1;
  array = (uint8_t *)malloc(__size);
  pvVar2 = malloc(__size);
  pvVar3 = malloc(__size);
  sVar6 = 0;
  while (__size != sVar6) {
    sprintf(student_prompt,"Please enter student %zu\'s mid-term mark: ",sVar6 + 1);
    iVar1 = query_int(student_prompt,0,0x14);
    array[sVar6] = (uint8_t)iVar1;
    query_initials((char *)((long)pvVar2 + sVar6),(char *)(sVar6 + (long)pvVar3));
    sVar6 = sVar6 + 1;
  }
  sVar4 = find_minimum(array,__size);
  sVar5 = find_maximum(array,__size);
  putchar(10);
  printf("The smallest note is %u.\n",(ulong)array[sVar4]);
  printf("The highest note is %u, it was obtained by %c%c.\n",(ulong)array[sVar5],
         (ulong)(uint)(int)*(char *)((long)pvVar2 + sVar5),
         (ulong)(uint)(int)*(char *)((long)pvVar3 + sVar5));
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Ask how many students will be processed
  const size_t n_students = (size_t)query_int("How many students to process? ", 10, 100);

  uint8_t* notes = (uint8_t*)malloc(sizeof(uint8_t) * n_students);
  char* first_name_initials = (char*)malloc(sizeof(char) * n_students);
  char* last_name_initials = (char*)malloc(sizeof(char) * n_students);

  // Prompt for each student
  for (size_t n = 0; n < n_students; n++) {
    char student_prompt[128];
    sprintf(student_prompt, "Please enter student %zu's mid-term mark: ", n + 1);
    notes[n] = (uint8_t)query_int(student_prompt, 0, 20);
    query_initials(&first_name_initials[n], &last_name_initials[n]);
  }

  // Get minimum and maximum indexes
  const size_t min_index = find_minimum(notes, n_students);
  const size_t max_index = find_maximum(notes, n_students);

  printf("\n");

  printf("The smallest note is %" PRIu8 ".\n", notes[min_index]);
  printf("The highest note is %" PRIu8 ", it was obtained by %c%c.\n", notes[max_index], first_name_initials[max_index], last_name_initials[max_index]);

  return 0;
}